

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

bool __thiscall
InsertProxyModel::insertColumns(InsertProxyModel *this,int column,int count,QModelIndex *parent)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  QModelIndex local_58;
  QModelIndex local_40;
  QModelIndex *local_28;
  QModelIndex *parent_local;
  int count_local;
  int column_local;
  InsertProxyModel *this_local;
  
  local_28 = parent;
  parent_local._0_4_ = count;
  parent_local._4_4_ = column;
  _count_local = this;
  bVar2 = QModelIndex::isValid(parent);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    lVar5 = QAbstractProxyModel::sourceModel();
    iVar1 = parent_local._4_4_;
    if (lVar5 == 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = true;
      if (-1 < parent_local._4_4_) {
        plVar6 = (long *)QAbstractProxyModel::sourceModel();
        QModelIndex::QModelIndex(&local_40);
        iVar4 = (**(code **)(*plVar6 + 0x80))(plVar6,&local_40);
        bVar2 = iVar4 < iVar1;
      }
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        plVar6 = (long *)QAbstractProxyModel::sourceModel();
        iVar4 = parent_local._4_4_;
        iVar1 = (int)parent_local;
        QModelIndex::QModelIndex(&local_58);
        bVar3 = (**(code **)(*plVar6 + 0x100))(plVar6,iVar4,iVar1,&local_58);
        this_local._7_1_ = (bool)(bVar3 & 1);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool InsertProxyModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    if (parent.isValid())
        return false;
    if (!sourceModel())
        return false;
    if (column < 0 || column > sourceModel()->columnCount())
        return false;
    return sourceModel()->insertColumns(column, count);
}